

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O1

int Msat_ReadInt(char **pIn)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  
  pbVar3 = (byte *)*pIn;
  while( true ) {
    if ((4 < *pbVar3 - 9) && (*pbVar3 != 0x20)) break;
    *pIn = (char *)(pbVar3 + 1);
    pbVar3 = pbVar3 + 1;
  }
  cVar1 = **pIn;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    *pIn = *pIn + 1;
  }
  if (0xf5 < (byte)(**pIn - 0x3aU)) {
    pcVar4 = *pIn;
    cVar5 = *pcVar4;
    iVar6 = 0;
    if ((byte)(cVar5 - 0x30U) < 10) {
      iVar6 = 0;
      do {
        pcVar4 = pcVar4 + 1;
        iVar6 = (uint)(byte)(cVar5 - 0x30) + iVar6 * 10;
        *pIn = pcVar4;
        cVar5 = *pcVar4;
      } while ((byte)(cVar5 - 0x30U) < 10);
    }
    iVar2 = -iVar6;
    if (cVar1 != '-') {
      iVar2 = iVar6;
    }
    return iVar2;
  }
  uVar7 = (ulong)(byte)**pIn;
  Msat_ReadInt_cold_1();
  return *(int *)(uVar7 + 0x60);
}

Assistant:

static int Msat_ReadInt( char ** pIn ) 
{
    int     val = 0;
    int     neg = 0;

    Msat_ReadWhitespace( pIn );
    if ( **pIn == '-' ) 
        neg = 1, 
        (*pIn)++;
    else if ( **pIn == '+' ) 
        (*pIn)++;
    if ( **pIn < '0' || **pIn > '9' ) 
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn), 
        exit(1);
    while ( **pIn >= '0' && **pIn <= '9' )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val; 
}